

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::EnhancedLayouts::TextureTestBase::getPassSnippet_abi_cxx11_
          (string *__return_storage_ptr__,TextureTestBase *this,GLuint param_1,
          VaryingPassthrough *varying_passthrough,STAGES stage)

{
  Variable *pVVar1;
  Variable *pVVar2;
  undefined4 in_flavour_00;
  size_type sVar3;
  reference pvVar4;
  GLchar *element;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  undefined1 local_a0 [8];
  string passthrough;
  FLAVOUR out_flavour;
  FLAVOUR in_flavour;
  Variable *out;
  Variable *in;
  VaryingConnection *connection;
  size_t sStack_58;
  GLuint i;
  size_t position;
  Vector *local_48;
  Vector *vector;
  allocator<char> local_2d;
  STAGES local_2c;
  VaryingPassthrough *pVStack_28;
  STAGES stage_local;
  VaryingPassthrough *varying_passthrough_local;
  TextureTestBase *pTStack_18;
  GLuint param_2_local;
  TextureTestBase *this_local;
  string *result;
  
  local_2c = stage;
  pVStack_28 = varying_passthrough;
  varying_passthrough_local._4_4_ = param_1;
  pTStack_18 = this;
  this_local = (TextureTestBase *)__return_storage_ptr__;
  if (stage == COMPUTE) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_2d);
    std::allocator<char>::~allocator(&local_2d);
  }
  else {
    local_48 = Utils::VaryingPassthrough::Get(varying_passthrough,stage);
    position._7_1_ = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"LIST",(allocator<char> *)((long)&position + 6));
    std::allocator<char>::~allocator((allocator<char> *)((long)&position + 6));
    sStack_58 = 0;
    for (connection._4_4_ = 0;
        sVar3 = std::
                vector<gl4cts::EnhancedLayouts::Utils::VaryingConnection,_std::allocator<gl4cts::EnhancedLayouts::Utils::VaryingConnection>_>
                ::size(local_48), connection._4_4_ < sVar3; connection._4_4_ = connection._4_4_ + 1)
    {
      pvVar4 = std::
               vector<gl4cts::EnhancedLayouts::Utils::VaryingConnection,_std::allocator<gl4cts::EnhancedLayouts::Utils::VaryingConnection>_>
               ::operator[](local_48,(ulong)connection._4_4_);
      pVVar1 = pvVar4->m_in;
      pVVar2 = pvVar4->m_out;
      passthrough.field_2._12_4_ = Utils::Variable::GetFlavour(local_2c,INPUT);
      passthrough.field_2._8_4_ = Utils::Variable::GetFlavour(local_2c,OUTPUT);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"",&local_c1);
      in_flavour_00 = passthrough.field_2._12_4_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"",&local_e9);
      getVariablePassthrough
                ((string *)local_a0,this,&local_c0,&pVVar1->m_descriptor,in_flavour_00,&local_e8,
                 &pVVar2->m_descriptor,passthrough.field_2._8_4_);
      std::__cxx11::string::~string((string *)&local_e8);
      std::allocator<char>::~allocator(&local_e9);
      std::__cxx11::string::~string((string *)&local_c0);
      std::allocator<char>::~allocator(&local_c1);
      element = (GLchar *)std::__cxx11::string::c_str();
      Utils::insertElementOfList
                (element,getPassSnippet::separator,&stack0xffffffffffffffa8,__return_storage_ptr__);
      std::__cxx11::string::~string((string *)local_a0);
    }
    Utils::endList("",&stack0xffffffffffffffa8,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TextureTestBase::getPassSnippet(GLuint /* test_case_index */,
											Utils::VaryingPassthrough& varying_passthrough, Utils::Shader::STAGES stage)
{
	static const GLchar* separator = "\n    ";

	/* Skip for compute shader */
	if (Utils::Shader::COMPUTE == stage)
	{
		return "";
	}

	Utils::VaryingConnection::Vector& vector = varying_passthrough.Get(stage);

	std::string result   = Utils::g_list;
	size_t		position = 0;

	for (GLuint i = 0; i < vector.size(); ++i)
	{

		Utils::VaryingConnection& connection = vector[i];

		Utils::Variable* in  = connection.m_in;
		Utils::Variable* out = connection.m_out;

		Utils::Variable::FLAVOUR in_flavour  = Utils::Variable::GetFlavour(stage, Utils::Variable::INPUT);
		Utils::Variable::FLAVOUR out_flavour = Utils::Variable::GetFlavour(stage, Utils::Variable::OUTPUT);

		const std::string passthrough =
			getVariablePassthrough("", in->m_descriptor, in_flavour, "", out->m_descriptor, out_flavour);

		Utils::insertElementOfList(passthrough.c_str(), separator, position, result);
	}

	Utils::endList("", position, result);

	return result;
}